

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::yml::Tree::duplicate_children_no_rep
          (Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  NodeData *pNVar11;
  char *__filename;
  csubstr *this_00;
  csubstr *pcVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  csubstr cVar16;
  ulong local_140;
  char msg [29];
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (node != NONE)",0x1d);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar2 = (code *)swi(3);
      sVar10 = (*pcVar2)();
      return sVar10;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar16.len;
    pcStack_40 = cVar16.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x65de) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x65de) << 0x40,8);
    LVar3.name.str = pcStack_40;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (parent == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (parent != NONE",0x1d);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar2 = (code *)swi(3);
      sVar10 = (*pcVar2)();
      return sVar10;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar16.len;
    pcStack_68 = cVar16.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x65df) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x65df) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var1)(msg,0x1f,LVar4,(this->m_callbacks).m_user_data);
  }
  local_140 = 0xffffffffffffffff;
  if (after != 0xffffffffffffffff) {
    bVar8 = has_child(this,parent,after);
    if (!bVar8) {
      builtin_strncpy(msg,"check failed: (after == NONE ",0x1d);
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar16.len;
      pcStack_90 = cVar16.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x65e0) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x65e0) << 0x40,8);
      LVar5.name.str = pcStack_90;
      LVar5.name.len = local_88;
      (*p_Var1)(msg,0x3a,LVar5,(this->m_callbacks).m_user_data);
    }
    sVar10 = first_child(this,parent);
    lVar15 = 0;
    while (sVar10 != 0xffffffffffffffff) {
      if (sVar10 == after) {
        if (lVar15 != 1) {
          local_140 = -lVar15;
          goto LAB_001b7538;
        }
        break;
      }
      sVar10 = next_sibling(this,sVar10);
      lVar15 = lVar15 + -1;
    }
    builtin_strncpy(msg,"check failed: (after_pos != N",0x1d);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar2 = (code *)swi(3);
      sVar10 = (*pcVar2)();
      return sVar10;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_b0 = cVar16.len;
    pcStack_b8 = cVar16.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x65f0) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x65f0) << 0x40,8);
    LVar6.name.str = pcStack_b8;
    LVar6.name.len = local_b0;
    (*p_Var1)(msg,0x22,LVar6,(this->m_callbacks).m_user_data);
  }
LAB_001b7538:
  sVar10 = first_child(src,node);
  do {
    if (sVar10 == 0xffffffffffffffff) {
      return (size_t)(char *)after;
    }
    pNVar11 = _p(this,parent);
    if (((pNVar11->m_type).type & SEQ) == NOTYPE) {
      pNVar11 = _p(this,parent);
      if (((pNVar11->m_type).type & MAP) == NOTYPE) {
        builtin_strncpy(msg,"check failed: (is_map(parent)",0x1d);
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          sVar10 = (*pcVar2)();
          return sVar10;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_d8 = cVar16.len;
        pcStack_e0 = cVar16.str;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x65fd) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x65fd) << 0x40,8);
        LVar7.name.str = pcStack_e0;
        LVar7.name.len = local_d8;
        (*p_Var1)(msg,0x1f,LVar7,(this->m_callbacks).m_user_data);
      }
      __filename = (char *)first_child(this,parent);
      uVar14 = 0;
      for (; __filename != (char *)0xffffffffffffffff;
          __filename = (char *)next_sibling(this,(size_t)__filename)) {
        this_00 = key(this,(size_t)__filename);
        pcVar12 = key(this,sVar10);
        iVar9 = basic_substring<const_char>::compare(this_00,pcVar12->str,pcVar12->len);
        if (iVar9 == 0) {
          if (local_140 <= uVar14 || local_140 == 0xffffffffffffffff) {
            pcVar13 = __filename;
            if (((char *)after != (char *)0xffffffffffffffff) &&
               (pcVar13 = (char *)after, __filename != (char *)after)) {
              move(this,(size_t)__filename,after);
              pcVar13 = __filename;
            }
            goto LAB_001b76d2;
          }
          remove(this,__filename);
          break;
        }
        uVar14 = uVar14 + 1;
      }
      pcVar13 = (char *)duplicate(this,src,sVar10,parent,after);
    }
    else {
      pcVar13 = (char *)duplicate(this,sVar10,parent,after);
    }
LAB_001b76d2:
    sVar10 = next_sibling(src,sVar10);
    after = (size_t)pcVar13;
  } while( true );
}

Assistant:

size_t Tree::duplicate_children_no_rep(Tree const *src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, after == NONE || has_child(parent, after));

    // don't loop using pointers as there may be a relocation

    // find the position where "after" is
    size_t after_pos = NONE;
    if(after != NONE)
    {
        for(size_t i = first_child(parent), icount = 0; i != NONE; ++icount, i = next_sibling(i))
        {
            if(i == after)
            {
                after_pos = icount;
                break;
            }
        }
        _RYML_CB_ASSERT(m_callbacks, after_pos != NONE);
    }

    // for each child to be duplicated...
    size_t prev = after;
    for(size_t i = src->first_child(node), icount = 0; i != NONE; ++icount, i = src->next_sibling(i))
    {
        if(is_seq(parent))
        {
            prev = duplicate(i, parent, prev);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(parent));
            // does the parent already have a node with key equal to that of the current duplicate?
            size_t rep = NONE, rep_pos = NONE;
            for(size_t j = first_child(parent), jcount = 0; j != NONE; ++jcount, j = next_sibling(j))
            {
                if(key(j) == key(i))
                {
                    rep = j;
                    rep_pos = jcount;
                    break;
                }
            }
            if(rep == NONE) // there is no repetition; just duplicate
            {
                prev = duplicate(src, i, parent, prev);
            }
            else  // yes, there is a repetition
            {
                if(after_pos != NONE && rep_pos < after_pos)
                {
                    // rep is located before the node which will be inserted,
                    // and will be overridden by the duplicate. So replace it.
                    remove(rep);
                    prev = duplicate(src, i, parent, prev);
                }
                else if(prev == NONE)
                {
                    // first iteration with prev = after = NONE and repetition
                    prev = rep;
                }
                else if(rep != prev)
                {
                    // rep is located after the node which will be inserted
                    // and overrides it. So move the rep into this node's place.
                    move(rep, prev);
                    prev = rep;
                }
            } // there's a repetition
        }
    }

    return prev;
}